

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O0

Vec_Wec_t * Acec_MatchCopy(Vec_Wec_t *vLits,Vec_Int_t *vMap)

{
  int iVar1;
  Vec_Wec_t *p;
  Vec_Int_t *p_00;
  int *pMap;
  undefined4 local_30;
  int iLit;
  int k;
  int i;
  Vec_Int_t *vLevel;
  Vec_Wec_t *vRes;
  Vec_Int_t *vMap_local;
  Vec_Wec_t *vLits_local;
  
  iVar1 = Vec_WecSize(vLits);
  p = Vec_WecStart(iVar1);
  for (iLit = 0; iVar1 = Vec_WecSize(vLits), iLit < iVar1; iLit = iLit + 1) {
    p_00 = Vec_WecEntry(vLits,iLit);
    for (local_30 = 0; iVar1 = Vec_IntSize(p_00), local_30 < iVar1; local_30 = local_30 + 1) {
      iVar1 = Vec_IntEntry(p_00,local_30);
      pMap = Vec_IntArray(vMap);
      iVar1 = Abc_Lit2LitL(pMap,iVar1);
      Vec_WecPush(p,iLit,iVar1);
    }
  }
  return p;
}

Assistant:

Vec_Wec_t * Acec_MatchCopy( Vec_Wec_t * vLits, Vec_Int_t * vMap )
{
    Vec_Wec_t * vRes = Vec_WecStart( Vec_WecSize(vLits) );
    Vec_Int_t * vLevel; int i, k, iLit;
    Vec_WecForEachLevel( vLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
            Vec_WecPush( vRes, i, Abc_Lit2LitL(Vec_IntArray(vMap), iLit) );
    return vRes;
}